

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void set_none_partition_params
               (AV1_COMP *cpi,ThreadData *td,MACROBLOCK *x,PC_TREE *pc_tree,
               PartitionSearchState *part_search_state,RD_STATS *best_remain_rdcost,
               RD_STATS *best_rdc,int *pt_cost)

{
  PICK_MODE_CONTEXT *pPVar1;
  long in_RCX;
  long in_RDX;
  long in_R8;
  RD_STATS partition_rdcost;
  PartitionBlkParams blk_params;
  PC_TREE_SHARED_BUFFERS *in_stack_00000138;
  BLOCK_SIZE in_stack_00000147;
  AV1_COMP *in_stack_00000148;
  RD_STATS *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int iVar2;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff84;
  undefined1 local_5c [28];
  int local_40;
  long local_28;
  long local_20;
  long local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  memcpy(local_5c,(void *)(in_R8 + 8),0x2c);
  if (*(long *)(local_20 + 8) == 0) {
    pPVar1 = av1_alloc_pmc(in_stack_00000148,in_stack_00000147,in_stack_00000138);
    *(PICK_MODE_CONTEXT **)(local_20 + 8) = pPVar1;
  }
  if (*(long *)(local_20 + 8) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(local_18 + 0x2b90),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate PICK_MODE_CONTEXT");
  }
  if (*(int *)(local_28 + 0x11c) != 0) {
    if (local_40 != 0) {
      if (**(int **)(local_28 + 0xb8) < 0x7fffffff) {
        in_stack_ffffffffffffff74 = **(int **)(local_28 + 0xb8);
      }
      else {
        in_stack_ffffffffffffff74 = 0;
      }
      *(int *)partition_rdcost._0_8_ = in_stack_ffffffffffffff74;
    }
    av1_init_rd_stats((RD_STATS *)&stack0xffffffffffffff78);
    iVar2 = *(int *)partition_rdcost._0_8_;
    av1_rd_cost_update(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    av1_rd_stats_subtraction
              (in_stack_ffffffffffffff84,(RD_STATS *)CONCAT44(in_stack_ffffffffffffff7c,iVar2),
               (RD_STATS *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

static void set_none_partition_params(const AV1_COMP *const cpi, ThreadData *td,
                                      MACROBLOCK *x, PC_TREE *pc_tree,
                                      PartitionSearchState *part_search_state,
                                      RD_STATS *best_remain_rdcost,
                                      RD_STATS *best_rdc, int *pt_cost) {
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  RD_STATS partition_rdcost;
  // Set PARTITION_NONE context.
  if (pc_tree->none == NULL)
    pc_tree->none = av1_alloc_pmc(cpi, blk_params.bsize, &td->shared_coeff_buf);
  if (!pc_tree->none)
    aom_internal_error(x->e_mbd.error_info, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate PICK_MODE_CONTEXT");

  // Set PARTITION_NONE type cost.
  if (part_search_state->partition_none_allowed) {
    if (blk_params.bsize_at_least_8x8) {
      *pt_cost = part_search_state->partition_cost[PARTITION_NONE] < INT_MAX
                     ? part_search_state->partition_cost[PARTITION_NONE]
                     : 0;
    }

    // Initialize the RD stats structure.
    av1_init_rd_stats(&partition_rdcost);
    partition_rdcost.rate = *pt_cost;
    av1_rd_cost_update(x->rdmult, &partition_rdcost);
    av1_rd_stats_subtraction(x->rdmult, best_rdc, &partition_rdcost,
                             best_remain_rdcost);
  }
}